

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O0

SAMTLabel *
jhu::thrax::anon_unknown_0::label(SAMTLabel *__return_storage_ptr__,Tree *tree,SpanPair nt)

{
  bool bVar1;
  Constituent *__t;
  ForwardApply *__t_00;
  BackwardApply *__t_01;
  Concat *__t_02;
  DoubleConcat *__t_03;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  Span local_104;
  undefined1 local_100 [8];
  optional<jhu::thrax::(anonymous_namespace)::DoubleConcat> dc;
  undefined1 local_c0 [8];
  optional<jhu::thrax::(anonymous_namespace)::Concat> cat;
  undefined1 local_90 [8];
  optional<jhu::thrax::(anonymous_namespace)::BackwardApply> ba;
  undefined1 local_60 [8];
  optional<jhu::thrax::(anonymous_namespace)::ForwardApply> fa;
  undefined1 local_30 [8];
  optional<jhu::thrax::(anonymous_namespace)::Constituent> label;
  Tree *tree_local;
  SpanPair nt_local;
  
  tree_local._4_4_ = nt.tgt;
  fa.super__Optional_base<jhu::thrax::(anonymous_namespace)::ForwardApply,_true,_true>._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::ForwardApply>._36_2_ =
       tree_local._4_2_;
  fa.super__Optional_base<jhu::thrax::(anonymous_namespace)::ForwardApply,_true,_true>._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::ForwardApply>._38_2_ =
       tree_local._6_2_;
  label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>._16_8_ = tree;
  constituent((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)local_30,tree,
              tree_local._4_4_);
  bVar1 = std::optional<jhu::thrax::(anonymous_namespace)::Constituent>::has_value
                    ((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)local_30);
  if (bVar1) {
    __t = std::optional<jhu::thrax::(anonymous_namespace)::Constituent>::operator*
                    ((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)local_30);
    std::
    variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
    ::
    variant<jhu::thrax::(anonymous_namespace)::Constituent&,void,void,jhu::thrax::(anonymous_namespace)::Constituent,void>
              ((variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
                *)__return_storage_ptr__,__t);
  }
  else {
    ba.super__Optional_base<jhu::thrax::(anonymous_namespace)::BackwardApply,_true,_true>._M_payload
    .super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::BackwardApply>._36_2_ =
         tree_local._4_2_;
    ba.super__Optional_base<jhu::thrax::(anonymous_namespace)::BackwardApply,_true,_true>._M_payload
    .super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::BackwardApply>._38_2_ =
         tree_local._6_2_;
    forwardApply((optional<jhu::thrax::(anonymous_namespace)::ForwardApply> *)local_60,
                 (Tree *)label.
                         super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                         ._16_8_,tree_local._4_4_);
    bVar1 = std::optional<jhu::thrax::(anonymous_namespace)::ForwardApply>::has_value
                      ((optional<jhu::thrax::(anonymous_namespace)::ForwardApply> *)local_60);
    if (bVar1) {
      __t_00 = std::optional<jhu::thrax::(anonymous_namespace)::ForwardApply>::operator*
                         ((optional<jhu::thrax::(anonymous_namespace)::ForwardApply> *)local_60);
      std::
      variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
      ::
      variant<jhu::thrax::(anonymous_namespace)::ForwardApply&,void,void,jhu::thrax::(anonymous_namespace)::ForwardApply,void>
                ((variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
                  *)__return_storage_ptr__,__t_00);
    }
    else {
      cat.super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>._M_payload.
      super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._36_2_ =
           tree_local._4_2_;
      cat.super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>._M_payload.
      super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._38_2_ =
           tree_local._6_2_;
      backwardApply((optional<jhu::thrax::(anonymous_namespace)::BackwardApply> *)local_90,
                    (Tree *)label.
                            super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                            ._16_8_,tree_local._4_4_);
      bVar1 = std::optional<jhu::thrax::(anonymous_namespace)::BackwardApply>::has_value
                        ((optional<jhu::thrax::(anonymous_namespace)::BackwardApply> *)local_90);
      if (bVar1) {
        __t_01 = std::optional<jhu::thrax::(anonymous_namespace)::BackwardApply>::operator*
                           ((optional<jhu::thrax::(anonymous_namespace)::BackwardApply> *)local_90);
        std::
        variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
        ::
        variant<jhu::thrax::(anonymous_namespace)::BackwardApply&,void,void,jhu::thrax::(anonymous_namespace)::BackwardApply,void>
                  ((variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
                    *)__return_storage_ptr__,__t_01);
      }
      else {
        dc.super__Optional_base<jhu::thrax::(anonymous_namespace)::DoubleConcat,_true,_true>.
        _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::DoubleConcat>.
        _52_2_ = tree_local._4_2_;
        dc.super__Optional_base<jhu::thrax::(anonymous_namespace)::DoubleConcat,_true,_true>.
        _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::DoubleConcat>.
        _54_2_ = tree_local._6_2_;
        concatenation((optional<jhu::thrax::(anonymous_namespace)::Concat> *)local_c0,
                      (Tree *)label.
                              super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                              ._16_8_,tree_local._4_4_);
        bVar1 = std::optional<jhu::thrax::(anonymous_namespace)::Concat>::has_value
                          ((optional<jhu::thrax::(anonymous_namespace)::Concat> *)local_c0);
        if (bVar1) {
          __t_02 = std::optional<jhu::thrax::(anonymous_namespace)::Concat>::operator*
                             ((optional<jhu::thrax::(anonymous_namespace)::Concat> *)local_c0);
          std::
          variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
          ::
          variant<jhu::thrax::(anonymous_namespace)::Concat&,void,void,jhu::thrax::(anonymous_namespace)::Concat,void>
                    ((variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
                      *)__return_storage_ptr__,__t_02);
        }
        else {
          local_104 = tree_local._4_4_;
          doubleConcatenation((optional<jhu::thrax::(anonymous_namespace)::DoubleConcat> *)local_100
                              ,(Tree *)label.
                                       super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                       ._16_8_,tree_local._4_4_);
          bVar1 = std::optional<jhu::thrax::(anonymous_namespace)::DoubleConcat>::has_value
                            ((optional<jhu::thrax::(anonymous_namespace)::DoubleConcat> *)local_100)
          ;
          if (bVar1) {
            __t_03 = std::optional<jhu::thrax::(anonymous_namespace)::DoubleConcat>::operator*
                               ((optional<jhu::thrax::(anonymous_namespace)::DoubleConcat> *)
                                local_100);
            std::
            variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
            ::
            variant<jhu::thrax::(anonymous_namespace)::DoubleConcat&,void,void,jhu::thrax::(anonymous_namespace)::DoubleConcat,void>
                      ((variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
                        *)__return_storage_ptr__,__t_03);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"X")
            ;
            std::
            variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
            ::
            variant<jhu::thrax::(anonymous_namespace)::Constituent,void,void,jhu::thrax::(anonymous_namespace)::Constituent,void>
                      ((variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>
                        *)__return_storage_ptr__,(Constituent *)&local_118);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SAMTLabel label(const Tree& tree, SpanPair nt) {
  if (auto label = constituent(tree, nt.tgt); label.has_value()) {
    return *label;
  }
  if (auto fa = forwardApply(tree, nt.tgt); fa.has_value()) {
    return *fa;
  }
  if (auto ba = backwardApply(tree, nt.tgt); ba.has_value()) {
    return *ba;
  }
  if (auto cat = concatenation(tree, nt.tgt); cat.has_value()) {
    return *cat;
  }
  if (auto dc = doubleConcatenation(tree, nt.tgt); dc.has_value()) {
    return *dc;
  }
  return Constituent{"X"};
}